

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMEntityImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMEntityImpl::DOMEntityImpl(DOMEntityImpl *this,DOMDocument *ownerDoc,XMLCh *eName)

{
  XMLCh *pXVar1;
  DOMDocumentImpl *local_68;
  DOMNode *local_40;
  XMLCh *eName_local;
  DOMDocument *ownerDoc_local;
  DOMEntityImpl *this_local;
  
  DOMEntity::DOMEntity(&this->super_DOMEntity);
  HasDOMNodeImpl::HasDOMNodeImpl(&this->super_HasDOMNodeImpl);
  HasDOMParentImpl::HasDOMParentImpl(&this->super_HasDOMParentImpl);
  (this->super_DOMEntity).super_DOMNode._vptr_DOMNode = (_func_int **)&PTR__DOMEntityImpl_0052a6c0;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl = (_func_int **)&PTR__DOMEntityImpl_0052a890;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl = (_func_int **)&PTR__DOMEntityImpl_0052a8c0
  ;
  local_40 = (DOMNode *)0x0;
  if (ownerDoc != (DOMDocument *)0x0) {
    local_40 = &ownerDoc->super_DOMNode;
  }
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,local_40);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,ownerDoc);
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fNotationName = (XMLCh *)0x0;
  this->fRefEntity = (DOMEntityReference *)0x0;
  this->fInputEncoding = (XMLCh *)0x0;
  this->fXmlEncoding = (XMLCh *)0x0;
  this->fXmlVersion = (XMLCh *)0x0;
  this->fBaseURI = (XMLCh *)0x0;
  this->fEntityRefNodeCloned = false;
  if (ownerDoc == (DOMDocument *)0x0) {
    local_68 = (DOMDocumentImpl *)0x0;
  }
  else {
    local_68 = (DOMDocumentImpl *)&ownerDoc[-1].super_DOMNode;
  }
  pXVar1 = DOMDocumentImpl::getPooledString(local_68,eName);
  this->fName = pXVar1;
  DOMNodeImpl::setReadOnly(&this->fNode,true,true);
  return;
}

Assistant:

DOMEntityImpl::DOMEntityImpl(DOMDocument *ownerDoc, const XMLCh *eName)
   : fNode(this, ownerDoc),
     fParent(this, ownerDoc),
     fPublicId(0),
     fSystemId(0),
     fNotationName(0),
     fRefEntity(0),
     fInputEncoding(0),
     fXmlEncoding(0),
     fXmlVersion(0),
     fBaseURI(0),
     fEntityRefNodeCloned(false)
{
    fName        = ((DOMDocumentImpl *)ownerDoc)->getPooledString(eName);
    fNode.setReadOnly(true, true);
}